

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

void __thiscall
Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  char (*in_RCX) [26];
  RefCountersImpl *pSrcPtr;
  string msg;
  string local_38;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (pObj == (ShaderResourceBindingVkImpl *)0x0) {
    return;
  }
  pSrcPtr = (pObj->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
            super_ObjectBase<Diligent::IShaderResourceBindingVk>.
            super_RefCountedObject<Diligent::IShaderResourceBindingVk>.m_pRefCounters;
  if (pSrcPtr == (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetReferenceCounters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x21b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pSrcPtr = (pObj->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
              super_ObjectBase<Diligent::IShaderResourceBindingVk>.
              super_RefCountedObject<Diligent::IShaderResourceBindingVk>.m_pRefCounters;
    if (pSrcPtr == (RefCountersImpl *)0x0) {
      pSrcPtr = (RefCountersImpl *)0x0;
      goto LAB_001db6b4;
    }
  }
  CheckDynamicType<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
            (&pSrcPtr->super_IReferenceCounters);
LAB_001db6b4:
  this->m_pRefCounters = pSrcPtr;
  LOCK();
  (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i =
       (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }